

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileStorage.cpp
# Opt level: O3

char * DynamicProfileStorage::AllocRecord(DWORD bufferSize)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  DWORD *pDVar4;
  
  if (!enabled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/DynamicProfileStorage.cpp"
                       ,0x47e,"(enabled)","enabled");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pDVar4 = (DWORD *)Memory::NoCheckHeapAllocator::Alloc
                              ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,
                               (ulong)bufferSize + 4);
  if (pDVar4 != (DWORD *)0x0) {
    *pDVar4 = bufferSize;
  }
  return (char *)pDVar4;
}

Assistant:

char * DynamicProfileStorage::AllocRecord(DWORD bufferSize)
{
    AssertOrFailFast(enabled);
    char * buffer = NoCheckHeapNewArray(char, bufferSize + sizeof(DWORD));
    if (buffer != nullptr)
    {
        *(DWORD *)buffer = bufferSize;
    }
    return buffer;
}